

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,QSqlDatabase>::emplace_helper<QSqlDatabase_const&>
          (QHash<QString,QSqlDatabase> *this,QString *key,QSqlDatabase *args)

{
  byte bVar1;
  Entry *pEVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  piter pVar6;
  long in_FS_OFFSET;
  QSqlDatabase local_50;
  InsertionResult local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.initialized = true;
  local_48._17_7_ = 0xaaaaaaaaaaaaaa;
  local_48.it.d = (Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *)0xaaaaaaaaaaaaaaaa;
  local_48.it.bucket = 0xaaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_QSqlDatabase>_>::findOrInsert<QString>
            (&local_48,*(Data<QHashPrivate::Node<QString,_QSqlDatabase>_> **)this,key);
  pEVar2 = (local_48.it.d)->spans[local_48.it.bucket >> 7].entries;
  bVar1 = (local_48.it.d)->spans[local_48.it.bucket >> 7].offsets[(uint)local_48.it.bucket & 0x7f];
  if (local_48.initialized == false) {
    pDVar3 = (key->d).d;
    (key->d).d = (Data *)0x0;
    pEVar2 = pEVar2 + bVar1;
    *(Data **)(pEVar2->storage).data = pDVar3;
    pcVar4 = (key->d).ptr;
    (key->d).ptr = (char16_t *)0x0;
    *(char16_t **)((pEVar2->storage).data + 8) = pcVar4;
    qVar5 = (key->d).size;
    (key->d).size = 0;
    *(qsizetype *)((pEVar2->storage).data + 0x10) = qVar5;
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)((pEVar2->storage).data + 0x18),args);
  }
  else {
    QSqlDatabase::QSqlDatabase(&local_50,args);
    QSqlDatabase::operator=((QSqlDatabase *)(pEVar2[bVar1].storage.data + 0x18),&local_50);
    QSqlDatabase::~QSqlDatabase(&local_50);
  }
  pVar6.bucket = local_48.it.bucket;
  pVar6.d = local_48.it.d;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)pVar6;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }